

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

EVclient_sinks
INT_EVclient_register_raw_sink_handler
          (CManager cm,char *name,EVRawHandlerFunc handler,void *client_data)

{
  int iVar1;
  _event_path_data *p_Var2;
  EVclient_sinks p_Var3;
  sink_table_elem *psVar4;
  char *pcVar5;
  
  p_Var2 = cm->evp;
  if ((long)p_Var2->sink_handler_count == 0) {
    psVar4 = (sink_table_elem *)INT_CMmalloc(0x20);
  }
  else {
    psVar4 = (sink_table_elem *)
             INT_CMrealloc(p_Var2->sink_handlers,(long)p_Var2->sink_handler_count * 0x20 + 0x20);
  }
  p_Var2->sink_handlers = psVar4;
  pcVar5 = strdup(name);
  p_Var3 = p_Var2->sink_handlers;
  iVar1 = p_Var2->sink_handler_count;
  p_Var3[iVar1].name = pcVar5;
  p_Var3[iVar1].format_list = (FMStructDescList)0x0;
  p_Var3[iVar1].handler = (EVSimpleHandlerFunc)handler;
  p_Var3[iVar1].client_data = client_data;
  p_Var2->sink_handler_count = iVar1 + 1;
  return p_Var3;
}

Assistant:

extern EVclient_sinks
INT_EVclient_register_raw_sink_handler(CManager cm, char *name, EVRawHandlerFunc handler, void *client_data)
{
    event_path_data evp = cm->evp;
    if (evp->sink_handler_count == 0) {
	evp->sink_handlers = malloc(sizeof(evp->sink_handlers[0]));
    } else {
	evp->sink_handlers = realloc(evp->sink_handlers,
				     sizeof(evp->sink_handlers[0]) * (evp->sink_handler_count + 1));
    }
    evp->sink_handlers[evp->sink_handler_count].name = strdup(name);
    evp->sink_handlers[evp->sink_handler_count].format_list = NULL;
    evp->sink_handlers[evp->sink_handler_count].handler = (EVSimpleHandlerFunc)handler;
    evp->sink_handlers[evp->sink_handler_count].client_data = client_data;
    evp->sink_handler_count++;
    return evp->sink_handlers;
}